

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall
aeron::Image::Image(Image *this,int32_t sessionId,int64_t correlationId,
                   int64_t subscriptionRegistrationId,string *sourceIdentity,
                   UnsafeBufferPosition *subscriberPosition,
                   shared_ptr<aeron::LogBuffers> *logBuffers,exception_handler_t *exceptionHandler)

{
  index_t value;
  int iVar1;
  element_type *peVar2;
  AtomicBuffer *pAVar3;
  reference pvVar4;
  int64_t iVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  string *in_R8;
  UnsafeBufferPosition *in_R9;
  index_t capacity;
  int i;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  Position<aeron::concurrent::status::UnsafeBufferPosition> *in_stack_ffffffffffffff50;
  function<void_(const_std::exception_&)> *in_stack_ffffffffffffff58;
  Header *in_stack_ffffffffffffff60;
  array<aeron::concurrent::AtomicBuffer,_3UL> *in_stack_ffffffffffffff80;
  int local_40;
  
  *in_RDI = &PTR__Image_0022d7c0;
  std::array<aeron::concurrent::AtomicBuffer,_3UL>::array(in_stack_ffffffffffffff80);
  peVar2 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e3d9c);
  LogBuffers::atomicBuffer(peVar2,3);
  concurrent::logbuffer::LogBufferDescriptor::initialTermId((AtomicBuffer *)0x1e3dba);
  peVar2 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e3dca);
  pAVar3 = LogBuffers::atomicBuffer(peVar2,0);
  concurrent::AtomicBuffer::capacity(pAVar3);
  concurrent::logbuffer::Header::Header
            (in_stack_ffffffffffffff60,(int32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (index_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  concurrent::status::Position<aeron::concurrent::status::UnsafeBufferPosition>::Position
            (in_stack_ffffffffffffff50,
             (UnsafeBufferPosition *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::shared_ptr<aeron::LogBuffers>::shared_ptr
            ((shared_ptr<aeron::LogBuffers> *)in_stack_ffffffffffffff50,
             (shared_ptr<aeron::LogBuffers> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::__cxx11::string::string((string *)(in_RDI + 0x16),in_R8);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  std::function<void_(const_std::exception_&)>::function
            ((function<void_(const_std::exception_&)> *)(in_RDI + 0x1b),in_stack_ffffffffffffff58);
  in_RDI[0x1f] = in_RDX;
  in_RDI[0x20] = in_RCX;
  *(undefined4 *)(in_RDI + 0x23) = in_ESI;
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    peVar2 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e3ed4);
    pAVar3 = LogBuffers::atomicBuffer(peVar2,local_40);
    pvVar4 = std::array<aeron::concurrent::AtomicBuffer,_3UL>::operator[]
                       ((array<aeron::concurrent::AtomicBuffer,_3UL> *)(in_RDI + 1),(long)local_40);
    concurrent::AtomicBuffer::operator=(pvVar4,pAVar3);
  }
  pvVar4 = std::array<aeron::concurrent::AtomicBuffer,_3UL>::operator[]
                     ((array<aeron::concurrent::AtomicBuffer,_3UL> *)(in_RDI + 1),0);
  value = concurrent::AtomicBuffer::capacity(pvVar4);
  iVar5 = concurrent::status::UnsafeBufferPosition::get(in_R9);
  in_RDI[0x21] = iVar5;
  in_RDI[0x22] = in_RDI[0x21];
  *(index_t *)((long)in_RDI + 0x11c) = value + -1;
  iVar1 = util::BitUtil::numberOfTrailingZeroes<int>(value);
  *(int *)(in_RDI + 0x24) = iVar1;
  *(undefined1 *)((long)in_RDI + 0x124) = 0;
  return;
}

Assistant:

Image(
        std::int32_t sessionId,
        std::int64_t correlationId,
        std::int64_t subscriptionRegistrationId,
        const std::string& sourceIdentity,
        UnsafeBufferPosition& subscriberPosition,
        std::shared_ptr<LogBuffers> logBuffers,
        const exception_handler_t& exceptionHandler) :
        m_header(
            LogBufferDescriptor::initialTermId(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
            logBuffers->atomicBuffer(0).capacity(),
            this),
        m_subscriberPosition(subscriberPosition),
        m_logBuffers(logBuffers),
        m_sourceIdentity(sourceIdentity),
        m_isClosed(false),
        m_exceptionHandler(exceptionHandler),
        m_correlationId(correlationId),
        m_subscriptionRegistrationId(subscriptionRegistrationId),
        m_sessionId(sessionId)
    {
        for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
        {
            m_termBuffers[i] = logBuffers->atomicBuffer(i);
        }

        const util::index_t capacity = m_termBuffers[0].capacity();

        m_joinPosition = subscriberPosition.get();
        m_finalPosition = m_joinPosition;
        m_termLengthMask = capacity - 1;
        m_positionBitsToShift = BitUtil::numberOfTrailingZeroes(capacity);
        m_isEos = false;
    }